

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O0

void bcwrite_ktabk(BCWriteCtx *ctx,cTValue *o,int narrow)

{
  double dVar1;
  uint uVar2;
  MSize len_00;
  undefined4 uVar3;
  int in_EDX;
  double *in_RSI;
  BCWriteCtx *in_RDI;
  double dVar4;
  int32_t k;
  lua_Number num;
  MSize len;
  GCstr *str;
  MSize in_stack_ffffffffffffff7c;
  BCWriteCtx *in_stack_ffffffffffffff80;
  
  if ((in_RDI->sb).sz < (in_RDI->sb).n + 0xb) {
    bcwrite_resize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(int *)((long)in_RSI + 4) == -5) {
    uVar2 = *(uint *)in_RSI;
    len_00 = *(MSize *)((ulong)uVar2 + 0xc);
    if ((in_RDI->sb).sz < (in_RDI->sb).n + len_00 + 5) {
      bcwrite_resize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
    bcwrite_uleb128(in_RDI,len_00 + 5);
    bcwrite_block(in_RDI,(void *)((ulong)uVar2 + 0x10),len_00);
  }
  else if (*(uint *)((long)in_RSI + 4) < 0xfffeffff) {
    if (in_EDX != 0) {
      dVar1 = *in_RSI;
      dVar4 = (double)(int)dVar1;
      if ((dVar1 == dVar4) && (!NAN(dVar1) && !NAN(dVar4))) {
        uVar2 = (in_RDI->sb).n;
        (in_RDI->sb).n = uVar2 + 1;
        (in_RDI->sb).buf[uVar2] = '\x03';
        bcwrite_uleb128(in_RDI,(int)dVar1);
        return;
      }
    }
    uVar2 = (in_RDI->sb).n;
    (in_RDI->sb).n = uVar2 + 1;
    (in_RDI->sb).buf[uVar2] = '\x04';
    bcwrite_uleb128(in_RDI,*(uint32_t *)in_RSI);
    bcwrite_uleb128(in_RDI,*(uint32_t *)((long)in_RSI + 4));
  }
  else {
    uVar3 = *(undefined4 *)((long)in_RSI + 4);
    uVar2 = (in_RDI->sb).n;
    (in_RDI->sb).n = uVar2 + 1;
    (in_RDI->sb).buf[uVar2] = (byte)uVar3 ^ 0xff;
  }
  return;
}

Assistant:

static void bcwrite_ktabk(BCWriteCtx *ctx, cTValue *o, int narrow)
{
  bcwrite_need(ctx, 1+10);
  if (tvisstr(o)) {
    const GCstr *str = strV(o);
    MSize len = str->len;
    bcwrite_need(ctx, 5+len);
    bcwrite_uleb128(ctx, BCDUMP_KTAB_STR+len);
    bcwrite_block(ctx, strdata(str), len);
  } else if (tvisint(o)) {
    bcwrite_byte(ctx, BCDUMP_KTAB_INT);
    bcwrite_uleb128(ctx, intV(o));
  } else if (tvisnum(o)) {
    if (!LJ_DUALNUM && narrow) {  /* Narrow number constants to integers. */
      lua_Number num = numV(o);
      int32_t k = lj_num2int(num);
      if (num == (lua_Number)k) {  /* -0 is never a constant. */
	bcwrite_byte(ctx, BCDUMP_KTAB_INT);
	bcwrite_uleb128(ctx, k);
	return;
      }
    }
    bcwrite_byte(ctx, BCDUMP_KTAB_NUM);
    bcwrite_uleb128(ctx, o->u32.lo);
    bcwrite_uleb128(ctx, o->u32.hi);
  } else {
    lua_assert(tvispri(o));
    bcwrite_byte(ctx, BCDUMP_KTAB_NIL+~itype(o));
  }
}